

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_common3<double>
               (Mesh *new_mesh,Int ent_dim,TagBase *tagbase,Write<double> *new_data)

{
  string *name_00;
  Int ent_dim_00;
  Mesh *this;
  Int ncomps_00;
  Write<double> local_58;
  Read<double> local_48;
  Int local_34;
  string *psStack_30;
  Int ncomps;
  string *name;
  Write<double> *new_data_local;
  TagBase *tagbase_local;
  Mesh *pMStack_10;
  Int ent_dim_local;
  Mesh *new_mesh_local;
  
  name = (string *)new_data;
  new_data_local = (Write<double> *)tagbase;
  tagbase_local._4_4_ = ent_dim;
  pMStack_10 = new_mesh;
  psStack_30 = TagBase::name_abi_cxx11_(tagbase);
  ncomps_00 = TagBase::ncomps((TagBase *)new_data_local);
  this = pMStack_10;
  ent_dim_00 = tagbase_local._4_4_;
  name_00 = psStack_30;
  local_34 = ncomps_00;
  Write<double>::Write(&local_58,new_data);
  Read<double>::Read(&local_48,&local_58);
  Mesh::add_tag<double>(this,ent_dim_00,name_00,ncomps_00,&local_48,true);
  Read<double>::~Read(&local_48);
  Write<double>::~Write(&local_58);
  return;
}

Assistant:

void transfer_common3(
    Mesh* new_mesh, Int ent_dim, TagBase const* tagbase, Write<T> new_data) {
  auto const& name = tagbase->name();
  auto ncomps = tagbase->ncomps();
  new_mesh->add_tag(ent_dim, name, ncomps, Read<T>(new_data), true);
}